

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_SubDVertex::SurfaceNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDVertex *this,ON_SubDFace *sector_face,
          bool bUndefinedNormalPossible)

{
  bool bVar1;
  undefined1 local_c8 [7];
  bool rc;
  ON_SubDSectorSurfacePoint limit_point;
  ON_SubDComponentPtr local_50;
  ON_SubDEdge *local_48;
  ON_SubDEdge *e [2];
  undefined1 local_30 [8];
  ON_SubDComponentPtrPair crease_pair;
  ON_SubDFace *pOStack_18;
  bool bUndefinedNormalPossible_local;
  ON_SubDFace *sector_face_local;
  ON_SubDVertex *this_local;
  
  crease_pair.m_pair[1].m_ptr._7_1_ = bUndefinedNormalPossible;
  if ((this->m_face_count == 0) || (this->m_faces == (ON_SubDFace **)0x0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
               ,0x2ab,"","No faces on this vertex.");
  }
  else {
    if ((sector_face == (ON_SubDFace *)0x0) && (bVar1 = IsCreaseOrCorner(this), bVar1)) {
      _local_30 = CreasedEdgePair(this,false);
      local_50 = ON_SubDComponentPtrPair::First((ON_SubDComponentPtrPair *)local_30);
      local_48 = ON_SubDComponentPtr::Edge(&local_50);
      limit_point.m_sector_face =
           (ON_SubDFace *)ON_SubDComponentPtrPair::Second((ON_SubDComponentPtrPair *)local_30);
      e[0] = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&limit_point.m_sector_face);
      if ((local_48 == (ON_SubDEdge *)0x0) ||
         (((local_48->m_face_count != 1 || (e[0] == (ON_SubDEdge *)0x0)) ||
          (e[0]->m_face_count != 1)))) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                   ,0x2b5,"","sector_face must be specified in this case.");
        goto LAB_008d1eac;
      }
    }
    pOStack_18 = sector_face;
    if (sector_face == (ON_SubDFace *)0x0) {
      pOStack_18 = *this->m_faces;
    }
    bVar1 = GetSurfacePoint(this,pOStack_18,(bool)(crease_pair.m_pair[1].m_ptr._7_1_ & 1),
                            (ON_SubDSectorSurfacePoint *)local_c8);
    if (bVar1) {
      ON_3dVector::ON_3dVector(__return_storage_ptr__,limit_point.m_limitT2 + 2);
      if ((crease_pair.m_pair[1].m_ptr._7_1_ & 1) != 0) {
        return __return_storage_ptr__;
      }
      bVar1 = ON_3dVector::IsZero(__return_storage_ptr__);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
    }
  }
LAB_008d1eac:
  __return_storage_ptr__->x = ON_3dVector::NanVector.x;
  __return_storage_ptr__->y = ON_3dVector::NanVector.y;
  __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDVertex::SurfaceNormal(
  const ON_SubDFace* sector_face,
  bool bUndefinedNormalPossible
) const
{
  for (;;)
  {
    if (m_face_count < 1 || nullptr == m_faces)
    {
      ON_ERROR("No faces on this vertex.");
      break;
    }

    if (nullptr == sector_face && IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair crease_pair = this->CreasedEdgePair(false);
      const ON_SubDEdge* e[2] = { crease_pair.First().Edge(), crease_pair.Second().Edge() };
      if (nullptr == e[0] || 1 != e[0]->m_face_count || nullptr == e[1] || 1 != e[1]->m_face_count)
      {
        ON_ERROR("sector_face must be specified in this case.");
        break;
      }
    }

    if (nullptr == sector_face)
      sector_face = m_faces[0];
    ON_SubDSectorSurfacePoint limit_point;
    bool rc = ON_SubDVertex::GetSurfacePoint(
      sector_face,
      bUndefinedNormalPossible,
      limit_point
    );
    if (false == rc)
      break;
    const ON_3dVector N(limit_point.m_limitN);
    if (false == bUndefinedNormalPossible && N.IsZero())
      break;
    return N;
  }

  return ON_3dVector::NanVector;
}